

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoader.h
# Opt level: O0

void __thiscall
frontend::loaders::SaveLoader<fp_remover::classes::Wrestler>::~SaveLoader
          (SaveLoader<fp_remover::classes::Wrestler> *this)

{
  byte bVar1;
  SaveLoader<fp_remover::classes::Wrestler> *this_local;
  
  this->_vptr_SaveLoader = (_func_int **)&PTR___cxa_pure_virtual_0010ed90;
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::fstream::close();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::clear
            (&this->contents);
  if (this->f != (fstream *)0x0) {
    (**(code **)(*(long *)this->f + 8))();
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector(&this->contents);
  std::__cxx11::string::~string((string *)&this->filename);
  return;
}

Assistant:

~SaveLoader()
	{
		if(f->is_open()) f->close();
		contents.clear();
		delete f;
	}